

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QASMFile.hpp
# Opt level: O1

int __thiscall qclab::io::QASMFile::parseQubit(QASMFile *this,string *str)

{
  int iVar1;
  string local_58;
  string local_38;
  
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"]","");
  left_of(&local_38,str,&local_58);
  iVar1 = read_value<int>(&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return iVar1;
}

Assistant:

int parseQubit( std::string& str ) const {
        return read_value< int >( left_of( str , "]" ) ) ;
      }